

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall
soul::heart::Parser::scanTopLevelItem
          (Parser *this,CodeLocation *moduleLocation,
          vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
          *scannedTopLevelItems,Module *newModule)

{
  SourceCodeText *pSVar1;
  SourceCodeText *o;
  pointer pcVar2;
  ScannedTopLevelItem newItem;
  string local_1c8;
  string local_1a8;
  ScannedTopLevelItem local_188;
  undefined1 local_e8 [184];
  
  local_188.module = newModule;
  memset(&local_188.moduleStartPos,0,0x98);
  (this->module).object = newModule;
  pSVar1 = (moduleLocation->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  o = (newModule->location).sourceCode.object;
  (newModule->location).sourceCode.object = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  (newModule->location).location.data = (moduleLocation->location).data;
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)local_e8,this);
  std::__cxx11::string::operator=((string *)&newModule->fullName,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  std::__cxx11::string::_M_assign((string *)&newModule->originalFullName);
  pcVar2 = (newModule->fullName)._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + (newModule->fullName)._M_string_length);
  TokenisedPathString::TokenisedPathString((TokenisedPathString *)local_e8,&local_1c8);
  TokenisedPathString::getLastPart_abi_cxx11_(&local_1a8,(TokenisedPathString *)local_e8);
  std::__cxx11::string::operator=((string *)&newModule->shortName,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_e8._40_8_ = 0;
  if (8 < (ulong)local_e8._48_8_) {
    if ((Section *)local_e8._32_8_ != (Section *)0x0) {
      operator_delete__((void *)local_e8._32_8_);
    }
    local_e8._32_8_ = local_e8 + 0x38;
    local_e8._48_8_ = 8;
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  parseAnnotation(this,&newModule->annotation);
  local_188.moduleStartPos.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  scanTopLevelItems(this,&local_188);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::emplace_back<soul::heart::Parser::ScannedTopLevelItem>(scannedTopLevelItems,&local_188);
  if (local_188.stateVariableDecls.
      super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.stateVariableDecls.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.stateVariableDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.stateVariableDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.outputDecls.super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.outputDecls.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.outputDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.outputDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.inputDecls.super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.inputDecls.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.inputDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.inputDecls.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.structBodyCode.
      super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.structBodyCode.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.structBodyCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.structBodyCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.functionBodyCode.
      super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.functionBodyCode.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.functionBodyCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.functionBodyCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.functionParamCode.
      super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.functionParamCode.
                    super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.functionParamCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.functionParamCode.
                          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void scanTopLevelItem (const CodeLocation& moduleLocation, std::vector<ScannedTopLevelItem>& scannedTopLevelItems, Module& newModule)
    {
        ScannedTopLevelItem newItem (newModule);
        module = newModule;

        newModule.location = moduleLocation;
        newModule.fullName = readQualifiedGeneralIdentifier();
        newModule.originalFullName = newModule.fullName;
        newModule.shortName = TokenisedPathString (newModule.fullName).getLastPart();
        parseAnnotation (newModule.annotation);
        newItem.moduleStartPos = getCurrentTokeniserPosition();
        scanTopLevelItems (newItem);
        scannedTopLevelItems.push_back (std::move (newItem));
    }